

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

int u8_strlen(char *s)

{
  uint32_t uVar1;
  int local_18;
  int local_14;
  int i;
  int count;
  char *s_local;
  
  local_14 = 0;
  local_18 = 0;
  _i = s;
  while( true ) {
    uVar1 = u8_nextchar(_i,&local_18);
    if (uVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int u8_strlen(const char *s)
{
    int count = 0;
    int i = 0;

    while (u8_nextchar(s, &i) != 0)
        count++;

    return count;
}